

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_set_iterator.c
# Opt level: O0

int mpt_object_set_iterator(mpt_object *obj,char *prop,mpt_iterator *it)

{
  int iVar1;
  mpt_convertable local_30;
  convIter conv;
  mpt_iterator *it_local;
  char *prop_local;
  mpt_object *obj_local;
  
  local_30._vptr = &mpt_object_set_iterator::convIterCtl;
  conv._ctl._vptr = (_mpt_vptr_convertable *)it;
  conv.it = it;
  iVar1 = (*obj->_vptr->set_property)(obj,prop,&local_30);
  return iVar1;
}

Assistant:

extern int mpt_object_set_iterator(MPT_INTERFACE(object) *obj, const char *prop, MPT_INTERFACE(iterator) *it)
{
	static const MPT_INTERFACE_VPTR(convertable) convIterCtl = {
		iteratorConv
	};
	struct convIter conv;
	
	conv._ctl._vptr = &convIterCtl;
	conv.it = it;
	
	return obj->_vptr->set_property(obj, prop, &conv._ctl);
}